

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionHandler.cpp
# Opt level: O0

bool __thiscall Shell::InductionTemplate::checkWellFoundedness(InductionTemplate *this)

{
  bool bVar1;
  byte bVar2;
  vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  *relatedTerms_00;
  TermList *this_00;
  long in_RDI;
  pair<Kernel::Term_*,_Kernel::Term_*> pVar3;
  reference rVar4;
  uint i;
  Term **r;
  iterator __end2;
  iterator __begin2;
  vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *__range2;
  Branch *b;
  iterator __end1;
  iterator __begin1;
  vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>
  *__range1;
  vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  relatedTerms;
  value_type *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee6;
  byte in_stack_fffffffffffffee7;
  _Bit_type in_stack_fffffffffffffee8;
  _Bit_type *in_stack_fffffffffffffef0;
  vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  *this_01;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  TermList in_stack_ffffffffffffff00;
  bool local_e9;
  reference local_a8;
  reference local_98;
  uint64_t local_88;
  uint local_80;
  pair<Kernel::Term_*,_Kernel::Term_*> local_70;
  reference local_60;
  Term **local_58;
  __normal_iterator<Kernel::Term_**,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
  local_50;
  reference local_48;
  reference local_40;
  Branch *local_38;
  __normal_iterator<Shell::InductionTemplate::Branch_*,_std::vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>_>
  local_30;
  
  std::
  vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  ::vector((vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
            *)0xba1c09);
  relatedTerms_00 =
       (vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
        *)(in_RDI + 0x18);
  local_30._M_current =
       (Branch *)
       std::
       vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>::
       begin((vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>
              *)in_stack_fffffffffffffed8);
  local_38 = (Branch *)
             std::
             vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>
             ::end((vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>
                    *)in_stack_fffffffffffffed8);
  rVar4._M_mask = in_stack_fffffffffffffee8;
  rVar4._M_p = in_stack_fffffffffffffef0;
  local_e9 = (bool)in_stack_fffffffffffffee7;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<Shell::InductionTemplate::Branch_*,_std::vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>_>
                        *)CONCAT17(local_e9,CONCAT16(in_stack_fffffffffffffee6,
                                                     CONCAT24(in_stack_fffffffffffffee4,
                                                              in_stack_fffffffffffffee0))),
                       (__normal_iterator<Shell::InductionTemplate::Branch_*,_std::vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>_>
                        *)in_stack_fffffffffffffed8);
    this_01 = (vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
               *)rVar4._M_p;
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<Shell::InductionTemplate::Branch_*,_std::vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>_>
               ::operator*(&local_30);
    local_40 = local_48;
    local_50._M_current =
         (Term **)std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::begin
                            ((vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)
                             in_stack_fffffffffffffed8);
    local_58 = (Term **)std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>::end
                                  ((vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_> *)
                                   in_stack_fffffffffffffed8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<Kernel::Term_**,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
                          *)CONCAT17(local_e9,CONCAT16(in_stack_fffffffffffffee6,
                                                       CONCAT24(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0))),
                         (__normal_iterator<Kernel::Term_**,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
                          *)in_stack_fffffffffffffed8);
      if (!bVar1) break;
      local_60 = __gnu_cxx::
                 __normal_iterator<Kernel::Term_**,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
                 ::operator*(&local_50);
      pVar3 = std::make_pair<Kernel::Term*&,Kernel::Term*&>
                        ((Term **)CONCAT17(local_e9,CONCAT16(in_stack_fffffffffffffee6,
                                                             CONCAT24(in_stack_fffffffffffffee4,
                                                                      in_stack_fffffffffffffee0))),
                         &in_stack_fffffffffffffed8->first);
      local_70 = pVar3;
      std::
      vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
      ::push_back((vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
                   *)CONCAT17(local_e9,CONCAT16(in_stack_fffffffffffffee6,
                                                CONCAT24(in_stack_fffffffffffffee4,
                                                         in_stack_fffffffffffffee0))),
                  in_stack_fffffffffffffed8);
      for (local_80 = 0; local_80 < *(uint *)(in_RDI + 4); local_80 = local_80 + 1) {
        local_88 = (uint64_t)
                   Kernel::OperatorType::arg
                             ((OperatorType *)rVar4._M_mask,
                              CONCAT13(local_e9,CONCAT12(in_stack_fffffffffffffee6,
                                                         in_stack_fffffffffffffee4)));
        bVar1 = Kernel::Signature::isTermAlgebraSort
                          ((Signature *)
                           CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
                           in_stack_ffffffffffffff00);
        if (bVar1) {
          rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             in_stack_ffffffffffffff00._content,
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          local_98 = rVar4;
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
          local_e9 = true;
          if (!bVar1) {
            this_00 = Kernel::Term::nthArgument(local_40->_header,local_80);
            in_stack_ffffffffffffff00._content =
                 (uint64_t)Kernel::Term::nthArgument(*local_60,local_80);
            in_stack_fffffffffffffeff =
                 Kernel::TermList::operator!=
                           (this_00,(TermList *)in_stack_ffffffffffffff00._content);
            local_e9 = (bool)in_stack_fffffffffffffeff;
          }
          rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             in_stack_ffffffffffffff00._content,
                             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
          local_a8 = rVar4;
          std::_Bit_reference::operator=(&local_a8,(bool)(local_e9 & 1));
        }
      }
      __gnu_cxx::
      __normal_iterator<Kernel::Term_**,_std::vector<Kernel::Term_*,_std::allocator<Kernel::Term_*>_>_>
      ::operator++(&local_50);
    }
    __gnu_cxx::
    __normal_iterator<Shell::InductionTemplate::Branch_*,_std::vector<Shell::InductionTemplate::Branch,_std::allocator<Shell::InductionTemplate::Branch>_>_>
    ::operator++(&local_30);
  }
  bVar2 = InductionPreprocessor::checkWellFoundedness(relatedTerms_00);
  std::
  vector<std::pair<Kernel::Term_*,_Kernel::Term_*>,_std::allocator<std::pair<Kernel::Term_*,_Kernel::Term_*>_>_>
  ::~vector(this_01);
  return (bool)(bVar2 & 1);
}

Assistant:

bool InductionTemplate::checkWellFoundedness()
{
  std::vector<pair<Term*, Term*>> relatedTerms;
  for (auto& b : _branches) {
    for (auto& r : b._recursiveCalls) {
      relatedTerms.push_back(make_pair(b._header, r));

      // fill in bit vector of induction variables
      for (unsigned i = 0; i < _arity; i++) {
        if (env.signature->isTermAlgebraSort(_type->arg(i))) {
          _indPos[i] = _indPos[i] || (*b._header->nthArgument(i) != *r->nthArgument(i));
        }
      }
    }
  }
  return InductionPreprocessor::checkWellFoundedness(relatedTerms);
}